

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbg.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  byte bVar2;
  ostream *poVar3;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_20;
  ostream *output_stream_1;
  ostringstream error_message_19;
  ofstream ofs_1;
  ostringstream error_message_18;
  ostream *output_stream;
  ostringstream error_message_17;
  ofstream ofs;
  ostringstream error_message_16;
  iterator itr_1;
  ostringstream error_message_15;
  vector<int,_std::allocator<int>_> codebook_indices;
  double total_distance;
  ostringstream error_message_14;
  LindeBuzoGrayAlgorithm codebook_design;
  vector<double,_std::allocator<double>_> tmp_1;
  ostringstream error_message_13;
  ifstream ifs2;
  ostringstream error_message_12;
  vector<double,_std::allocator<double>_> mean;
  ostringstream error_message_11;
  iterator itr;
  Buffer buffer;
  StatisticsAccumulation statistics_accumulation;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  codebook_vectors;
  vector<double,_std::allocator<double>_> tmp;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  input_vectors;
  int length;
  istream *input_stream;
  ostringstream error_message_10;
  ifstream ifs;
  ostringstream error_message_9;
  char *input_file;
  ostringstream error_message_8;
  int num_input_files;
  ostringstream error_message_7;
  ostringstream error_message_6;
  ostringstream error_message_5;
  ostringstream error_message_4;
  ostringstream error_message_3;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  double splitting_factor;
  double convergence_threshold;
  int num_iteration;
  int min_num_vector_in_cluster;
  char *total_distance_file;
  char *codebook_index_file;
  char *initial_codebook_file;
  int target_codebook_size;
  int seed;
  int num_order;
  option *in_stack_ffffffffffffcef8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar4;
  undefined4 uVar5;
  LindeBuzoGrayAlgorithm *in_stack_ffffffffffffcf00;
  string *in_stack_ffffffffffffcf08;
  allocator *paVar6;
  undefined4 in_stack_ffffffffffffcf10;
  int in_stack_ffffffffffffcf14;
  size_type in_stack_ffffffffffffcf18;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffcf20;
  undefined7 in_stack_ffffffffffffcf28;
  undefined1 in_stack_ffffffffffffcf2f;
  int *in_stack_ffffffffffffcf30;
  char *pcVar7;
  undefined4 in_stack_ffffffffffffcf38;
  int in_stack_ffffffffffffcf3c;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffcf40;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffcf48;
  vector<int,_std::allocator<int>_> *this;
  int in_stack_ffffffffffffcf50;
  undefined2 in_stack_ffffffffffffcf54;
  undefined1 in_stack_ffffffffffffcf56;
  undefined1 in_stack_ffffffffffffcf57;
  StatisticsAccumulation *in_stack_ffffffffffffcf58;
  int seed_00;
  int *in_stack_ffffffffffffcf60;
  ostream *in_stack_ffffffffffffcf80;
  char *local_2fc0;
  Buffer *in_stack_ffffffffffffd058;
  undefined7 in_stack_ffffffffffffd060;
  byte in_stack_ffffffffffffd067;
  StatisticsAccumulation *in_stack_ffffffffffffd068;
  StatisticsAccumulation *local_2f78;
  bool local_2f4a;
  bool local_2f22;
  allocator *in_stack_ffffffffffffd0e8;
  string *in_stack_ffffffffffffd0f0;
  bool local_2efa;
  double *in_stack_ffffffffffffd108;
  allocator *in_stack_ffffffffffffd110;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffd118;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffd120;
  ostringstream *this_00;
  undefined5 in_stack_ffffffffffffd128;
  byte in_stack_ffffffffffffd12d;
  undefined1 in_stack_ffffffffffffd12e;
  undefined1 in_stack_ffffffffffffd12f;
  bool local_2eaa;
  bool local_2e52;
  bool local_2e2a;
  allocator local_2e09;
  string local_2e08 [32];
  ostringstream local_2de8 [376];
  char *local_2c70;
  allocator local_2c61;
  string local_2c60 [32];
  ostringstream local_2c40 [376];
  char local_2ac8 [519];
  allocator local_28c1;
  string local_28c0 [32];
  ostringstream local_28a0 [376];
  char *local_2728;
  allocator local_2719;
  string local_2718 [32];
  ostringstream local_26f8 [376];
  char local_2580 [519];
  allocator local_2379;
  string local_2378 [32];
  ostringstream local_2358 [376];
  vector<double,_std::allocator<double>_> *local_21e0;
  __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_21d8;
  allocator local_21c9;
  string local_21c8 [32];
  ostringstream local_21a8 [384];
  vector<int,_std::allocator<int>_> local_2028;
  allocator local_2001;
  string local_2000 [32];
  ostringstream local_1fe0 [376];
  LindeBuzoGrayAlgorithm local_1e68;
  allocator local_1da1;
  string local_1da0 [32];
  ostringstream local_1d80 [376];
  char local_1c08 [527];
  allocator local_19f9;
  string local_19f8 [32];
  ostringstream local_19d8 [415];
  allocator local_1839;
  string local_1838 [32];
  ostringstream local_1818 [376];
  vector<double,_std::allocator<double>_> *local_16a0;
  __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
  local_1698 [17];
  StatisticsAccumulation local_1610;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_15f8 [2];
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_15c0;
  int local_15a4;
  char *local_15a0;
  int local_1598;
  allocator local_1591;
  string local_1590 [32];
  ostringstream local_1570 [376];
  char local_13f8 [527];
  allocator local_11e9;
  string local_11e8 [32];
  ostringstream local_11c8 [376];
  StatisticsAccumulation *local_1050;
  allocator local_1041;
  string local_1040 [32];
  ostringstream local_1020 [376];
  int local_ea8;
  allocator local_ea1;
  string local_ea0 [32];
  ostringstream local_e80 [383];
  allocator local_d01;
  string local_d00 [39];
  allocator local_cd9;
  string local_cd8 [32];
  ostringstream local_cb8 [383];
  allocator local_b39;
  string local_b38 [39];
  allocator local_b11;
  string local_b10 [32];
  ostringstream local_af0 [383];
  allocator local_971;
  string local_970 [39];
  allocator local_949;
  string local_948 [32];
  ostringstream local_928 [383];
  allocator local_7a9;
  string local_7a8 [39];
  allocator local_781;
  string local_780 [32];
  ostringstream local_760 [383];
  allocator local_5e1;
  string local_5e0 [39];
  allocator local_5b9;
  string local_5b8 [32];
  ostringstream local_598 [383];
  allocator local_419;
  string local_418 [39];
  allocator local_3f1;
  string local_3f0 [32];
  ostringstream local_3d0 [383];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [32];
  ostringstream local_208 [399];
  allocator local_79;
  string local_78 [36];
  int local_54;
  double local_50;
  double local_48;
  int local_40;
  int local_3c;
  char *local_38;
  char *local_30;
  char *local_28;
  int local_1c;
  undefined4 local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_18 = 1;
  local_1c = 0x100;
  local_28 = (char *)0x0;
  local_30 = (char *)0x0;
  local_38 = (char *)0x0;
  local_3c = 1;
  local_40 = 1000;
  local_48 = 1e-05;
  local_50 = 1e-05;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_54 = ya_getopt_long(in_stack_ffffffffffffcf14,(char **)in_stack_ffffffffffffcf08,
                                   (char *)in_stack_ffffffffffffcf00,in_stack_ffffffffffffcef8,
                                   (int *)0x1038b1), pcVar7 = ya_optarg, local_54 != -1) {
    switch(local_54) {
    case 0x43:
      local_28 = ya_optarg;
      break;
    default:
      anon_unknown.dwarf_3743::PrintUsage(in_stack_ffffffffffffcf80);
      return 1;
    case 0x49:
      local_30 = ya_optarg;
      break;
    case 0x53:
      local_38 = ya_optarg;
      break;
    case 100:
      in_stack_ffffffffffffd0e8 = &local_b39;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b38,pcVar7,in_stack_ffffffffffffd0e8);
      bVar1 = sptk::ConvertStringToDouble
                        (in_stack_ffffffffffffcf08,(double *)in_stack_ffffffffffffcf00);
      local_2f22 = !bVar1 || local_48 < 0.0;
      std::__cxx11::string::~string(local_b38);
      std::allocator<char>::~allocator((allocator<char> *)&local_b39);
      if (local_2f22) {
        std::__cxx11::ostringstream::ostringstream(local_cb8);
        std::operator<<((ostream *)local_cb8,
                        "The argument for the -d option must be a non-negative number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_cd8,"lbg",&local_cd9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
        std::__cxx11::string::~string(local_cd8);
        std::allocator<char>::~allocator((allocator<char> *)&local_cd9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_cb8);
        return local_4;
      }
      break;
    case 0x65:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_5e0,pcVar7,&local_5e1);
      bVar1 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffcf08,(int *)in_stack_ffffffffffffcf00);
      local_2eaa = !bVar1 || local_1c < 2;
      std::__cxx11::string::~string(local_5e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
      if (local_2eaa) {
        std::__cxx11::ostringstream::ostringstream(local_760);
        std::operator<<((ostream *)local_760,"The argument for the -e option must be greater than 1"
                       );
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_780,"lbg",&local_781);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
        std::__cxx11::string::~string(local_780);
        std::allocator<char>::~allocator((allocator<char> *)&local_781);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_760);
        return local_4;
      }
      break;
    case 0x68:
      anon_unknown.dwarf_3743::PrintUsage(in_stack_ffffffffffffcf80);
      return 0;
    case 0x69:
      in_stack_ffffffffffffd110 = &local_971;
      in_stack_ffffffffffffd108 = (double *)ya_optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_970,(char *)in_stack_ffffffffffffd108,in_stack_ffffffffffffd110);
      bVar1 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffcf08,(int *)in_stack_ffffffffffffcf00);
      local_2efa = !bVar1 || local_40 < 1;
      std::__cxx11::string::~string(local_970);
      std::allocator<char>::~allocator((allocator<char> *)&local_971);
      if (local_2efa) {
        std::__cxx11::ostringstream::ostringstream(local_af0);
        std::operator<<((ostream *)local_af0,
                        "The argument for the -i option must be a positive integer");
        paVar6 = &local_b11;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_b10,"lbg",paVar6);
        sptk::PrintErrorMessage((string *)paVar6,(ostringstream *)in_stack_ffffffffffffd0e8);
        std::__cxx11::string::~string(local_b10);
        std::allocator<char>::~allocator((allocator<char> *)&local_b11);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_af0);
        return local_4;
      }
      break;
    case 0x6c:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,pcVar7,&local_79);
      bVar1 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffcf08,(int *)in_stack_ffffffffffffcf00);
      local_2e2a = !bVar1 || local_14 < 1;
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      if (local_2e2a) {
        std::__cxx11::ostringstream::ostringstream(local_208);
        std::operator<<((ostream *)local_208,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_228,"lbg",&local_229);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
        std::__cxx11::string::~string(local_228);
        std::allocator<char>::~allocator((allocator<char> *)&local_229);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_208);
        return local_4;
      }
      local_14 = local_14 + -1;
      break;
    case 0x6d:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_250,pcVar7,&local_251);
      bVar1 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffcf08,(int *)in_stack_ffffffffffffcf00);
      local_2e52 = !bVar1 || local_14 < 0;
      std::__cxx11::string::~string(local_250);
      std::allocator<char>::~allocator((allocator<char> *)&local_251);
      if (local_2e52) {
        std::__cxx11::ostringstream::ostringstream(local_3d0);
        poVar3 = std::operator<<((ostream *)local_3d0,"The argument for the -m option must be a ");
        std::operator<<(poVar3,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3f0,"lbg",&local_3f1);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
        std::__cxx11::string::~string(local_3f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3d0);
        return local_4;
      }
      break;
    case 0x6e:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_7a8,pcVar7,&local_7a9);
      in_stack_ffffffffffffd12f =
           sptk::ConvertStringToInteger(in_stack_ffffffffffffcf08,(int *)in_stack_ffffffffffffcf00);
      in_stack_ffffffffffffd12d = !(bool)in_stack_ffffffffffffd12f || local_3c < 1;
      in_stack_ffffffffffffd12e = in_stack_ffffffffffffd12d;
      std::__cxx11::string::~string(local_7a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_7a9);
      if ((in_stack_ffffffffffffd12d & 1) != 0) {
        this_00 = local_928;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::operator<<((ostream *)this_00,
                        "The argument for the -n option must be a positive integer");
        paVar6 = &local_949;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_948,"lbg",paVar6);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
        std::__cxx11::string::~string(local_948);
        std::allocator<char>::~allocator((allocator<char> *)&local_949);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_928);
        return local_4;
      }
      break;
    case 0x72:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d00,pcVar7,&local_d01);
      bVar1 = sptk::ConvertStringToDouble
                        (in_stack_ffffffffffffcf08,(double *)in_stack_ffffffffffffcf00);
      local_2f4a = !bVar1 || local_50 <= 0.0;
      std::__cxx11::string::~string(local_d00);
      std::allocator<char>::~allocator((allocator<char> *)&local_d01);
      if (local_2f4a) {
        std::__cxx11::ostringstream::ostringstream(local_e80);
        std::operator<<((ostream *)local_e80,
                        "The argument for the -r option must be a positive number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_ea0,"lbg",&local_ea1);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
        std::__cxx11::string::~string(local_ea0);
        std::allocator<char>::~allocator((allocator<char> *)&local_ea1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_e80);
        return local_4;
      }
      break;
    case 0x73:
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_418,pcVar7,&local_419);
      bVar1 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffcf08,(int *)in_stack_ffffffffffffcf00);
      std::__cxx11::string::~string(local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_598);
        std::operator<<((ostream *)local_598,"The argument for the -s option must be an integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5b8,"lbg",&local_5b9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
        std::__cxx11::string::~string(local_5b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_598);
        return local_4;
      }
    }
  }
  local_ea8 = local_8 - ya_optind;
  if (1 < local_ea8) {
    std::__cxx11::ostringstream::ostringstream(local_1020);
    std::operator<<((ostream *)local_1020,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1040,"lbg",&local_1041);
    sptk::PrintErrorMessage(in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string(local_1040);
    std::allocator<char>::~allocator((allocator<char> *)&local_1041);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1020);
    return local_4;
  }
  if (local_ea8 == 0) {
    local_2f78 = (StatisticsAccumulation *)0x0;
  }
  else {
    local_2f78 = *(StatisticsAccumulation **)(local_10 + (long)ya_optind * 8);
  }
  local_1050 = local_2f78;
  bVar1 = sptk::SetBinaryMode();
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_11c8);
    std::operator<<((ostream *)local_11c8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_11e8,"lbg",&local_11e9);
    sptk::PrintErrorMessage(in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
    std::__cxx11::string::~string(local_11e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_11e9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_11c8);
    return local_4;
  }
  std::ifstream::ifstream(local_13f8);
  if (local_1050 != (StatisticsAccumulation *)0x0) {
    in_stack_ffffffffffffd068 = local_1050;
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_13f8,(_Ios_Openmode)in_stack_ffffffffffffd068);
    in_stack_ffffffffffffd067 = std::ios::fail();
    if ((in_stack_ffffffffffffd067 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_1570);
      poVar3 = std::operator<<((ostream *)local_1570,"Cannot open file ");
      std::operator<<(poVar3,(char *)local_1050);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1590,"lbg",&local_1591);
      sptk::PrintErrorMessage(in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
      std::__cxx11::string::~string(local_1590);
      std::allocator<char>::~allocator((allocator<char> *)&local_1591);
      local_4 = 1;
      local_1598 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1570);
      goto LAB_001065cd;
    }
  }
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    local_2fc0 = (char *)&std::cin;
  }
  else {
    local_2fc0 = local_13f8;
  }
  local_15a0 = local_2fc0;
  local_15a4 = local_14 + 1;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x104ff1);
  std::allocator<double>::allocator((allocator<double> *)0x105016);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffcf20,in_stack_ffffffffffffcf18,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10));
  std::allocator<double>::~allocator((allocator<double> *)0x105042);
  while( true ) {
    pvVar4 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)0x0;
    bVar1 = sptk::ReadStream<double>
                      ((bool)in_stack_ffffffffffffcf56,in_stack_ffffffffffffcf50,
                       (int)((ulong)in_stack_ffffffffffffcf48 >> 0x20),
                       (int)in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40,
                       (istream *)CONCAT44(in_stack_ffffffffffffcf3c,in_stack_ffffffffffffcf38),
                       in_stack_ffffffffffffcf60);
    if (!bVar1) break;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10),
                (value_type *)in_stack_ffffffffffffcf08);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10));
  bVar1 = std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::empty((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10));
  if (bVar1) {
    local_4 = 0;
    local_1598 = 1;
  }
  else {
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)0x105131);
    if (local_28 == (char *)0x0) {
      sptk::StatisticsAccumulation::StatisticsAccumulation(&local_1610,local_14,1,false,false);
      sptk::StatisticsAccumulation::Buffer::Buffer
                ((Buffer *)CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10));
      local_1698[0]._M_current =
           (vector<double,_std::allocator<double>_> *)
           std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin(pvVar4);
      while( true ) {
        local_16a0 = (vector<double,_std::allocator<double>_> *)
                     std::
                     vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ::end(pvVar4);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                            *)in_stack_ffffffffffffcf00,
                           (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                            *)pvVar4);
        seed_00 = (int)in_stack_ffffffffffffcf60;
        if (!bVar1) break;
        __gnu_cxx::
        __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator*(local_1698);
        bVar1 = sptk::StatisticsAccumulation::Run
                          (in_stack_ffffffffffffd068,
                           (vector<double,_std::allocator<double>_> *)
                           CONCAT17(in_stack_ffffffffffffd067,in_stack_ffffffffffffd060),
                           in_stack_ffffffffffffd058);
        seed_00 = (int)in_stack_ffffffffffffcf60;
        if (!bVar1) {
          std::__cxx11::ostringstream::ostringstream(local_1818);
          uVar5 = (undefined4)((ulong)pvVar4 >> 0x20);
          std::operator<<((ostream *)local_1818,"Failed to initialize codebook");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_1838,"lbg",&local_1839);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
          std::__cxx11::string::~string(local_1838);
          std::allocator<char>::~allocator((allocator<char> *)&local_1839);
          local_4 = 1;
          local_1598 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_1818);
          goto LAB_00105584;
        }
        __gnu_cxx::
        __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator++(local_1698);
      }
      std::allocator<double>::allocator((allocator<double> *)0x105399);
      uVar5 = (undefined4)((ulong)pvVar4 >> 0x20);
      std::vector<double,_std::allocator<double>_>::vector
                (in_stack_ffffffffffffcf20,in_stack_ffffffffffffcf18,
                 (allocator_type *)CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10));
      std::allocator<double>::~allocator((allocator<double> *)0x1053c5);
      bVar1 = sptk::StatisticsAccumulation::GetMean
                        (in_stack_ffffffffffffcf58,
                         (Buffer *)
                         CONCAT17(in_stack_ffffffffffffcf57,
                                  CONCAT16(in_stack_ffffffffffffcf56,
                                           CONCAT24(in_stack_ffffffffffffcf54,
                                                    in_stack_ffffffffffffcf50))),
                         in_stack_ffffffffffffcf48);
      if (bVar1) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10),
                    (value_type *)in_stack_ffffffffffffcf08);
        local_1598 = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_19d8);
        std::operator<<((ostream *)local_19d8,"Failed to initialize codebook");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_19f8,"lbg",&local_19f9);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
        std::__cxx11::string::~string(local_19f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_19f9);
        local_4 = 1;
        local_1598 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_19d8);
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10));
LAB_00105584:
      sptk::StatisticsAccumulation::Buffer::~Buffer((Buffer *)in_stack_ffffffffffffcf00);
      sptk::StatisticsAccumulation::~StatisticsAccumulation(&local_1610);
    }
    else {
      std::ifstream::ifstream(local_1c08);
      pcVar7 = local_28;
      uVar5 = (undefined4)((ulong)pvVar4 >> 0x20);
      std::operator|(_S_in,_S_bin);
      std::ifstream::open(local_1c08,(_Ios_Openmode)pcVar7);
      bVar2 = std::ios::fail();
      if ((bVar2 & 1) == 0) {
        std::allocator<double>::allocator((allocator<double> *)0x1057e1);
        std::vector<double,_std::allocator<double>_>::vector
                  (in_stack_ffffffffffffcf20,in_stack_ffffffffffffcf18,
                   (allocator_type *)CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10));
        std::allocator<double>::~allocator((allocator<double> *)0x10580d);
        while( true ) {
          uVar5 = 0;
          bVar1 = sptk::ReadStream<double>
                            ((bool)in_stack_ffffffffffffcf56,in_stack_ffffffffffffcf50,
                             (int)((ulong)in_stack_ffffffffffffcf48 >> 0x20),
                             (int)in_stack_ffffffffffffcf48,in_stack_ffffffffffffcf40,
                             (istream *)
                             CONCAT44(in_stack_ffffffffffffcf3c,in_stack_ffffffffffffcf38),
                             in_stack_ffffffffffffcf60);
          if (!bVar1) break;
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *)CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10),
                      (value_type *)in_stack_ffffffffffffcf08);
        }
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10));
        seed_00 = (int)in_stack_ffffffffffffcf60;
        local_1598 = 0;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1d80);
        seed_00 = (int)in_stack_ffffffffffffcf60;
        poVar3 = std::operator<<((ostream *)local_1d80,"Cannot open file ");
        std::operator<<(poVar3,local_28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1da0,"lbg",&local_1da1);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
        std::__cxx11::string::~string(local_1da0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1da1);
        local_4 = 1;
        local_1598 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1d80);
      }
      std::ifstream::~ifstream(local_1c08);
    }
    if (local_1598 == 0) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::size(local_15f8);
      pvVar4 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)CONCAT44(uVar5,local_18);
      sptk::LindeBuzoGrayAlgorithm::LindeBuzoGrayAlgorithm
                ((LindeBuzoGrayAlgorithm *)
                 CONCAT17(in_stack_ffffffffffffcf57,
                          CONCAT16(in_stack_ffffffffffffcf56,
                                   CONCAT24(in_stack_ffffffffffffcf54,in_stack_ffffffffffffcf50))),
                 (int)((ulong)in_stack_ffffffffffffcf48 >> 0x20),(int)in_stack_ffffffffffffcf48,
                 (int)((ulong)in_stack_ffffffffffffcf40 >> 0x20),(int)in_stack_ffffffffffffcf40,
                 in_stack_ffffffffffffcf3c,(double)in_stack_ffffffffffffcf30,
                 (double)CONCAT17(in_stack_ffffffffffffcf2f,in_stack_ffffffffffffcf28),seed_00);
      bVar1 = sptk::LindeBuzoGrayAlgorithm::IsValid(&local_1e68);
      if (bVar1) {
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::size(&local_15c0);
        std::allocator<int>::allocator((allocator<int> *)0x105ae7);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffcf20,
                   in_stack_ffffffffffffcf18,
                   (allocator_type *)CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10));
        std::allocator<int>::~allocator((allocator<int> *)0x105b13);
        bVar1 = sptk::LindeBuzoGrayAlgorithm::Run
                          ((LindeBuzoGrayAlgorithm *)
                           CONCAT17(in_stack_ffffffffffffd12f,
                                    CONCAT16(in_stack_ffffffffffffd12e,
                                             CONCAT15(in_stack_ffffffffffffd12d,
                                                      in_stack_ffffffffffffd128))),
                           in_stack_ffffffffffffd120,in_stack_ffffffffffffd118,
                           (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd110,
                           in_stack_ffffffffffffd108);
        if (bVar1) {
          local_21d8._M_current =
               (vector<double,_std::allocator<double>_> *)
               std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::begin(pvVar4);
          while( true ) {
            local_21e0 = (vector<double,_std::allocator<double>_> *)
                         std::
                         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ::end(pvVar4);
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                *)in_stack_ffffffffffffcf00,
                               (__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                *)pvVar4);
            if (!bVar1) break;
            __gnu_cxx::
            __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator*(&local_21d8);
            bVar1 = sptk::WriteStream<double>
                              (in_stack_ffffffffffffcf50,
                               (int)((ulong)in_stack_ffffffffffffcf48 >> 0x20),
                               in_stack_ffffffffffffcf40,
                               (ostream *)
                               CONCAT44(in_stack_ffffffffffffcf3c,in_stack_ffffffffffffcf38),
                               in_stack_ffffffffffffcf30);
            if (!bVar1) {
              std::__cxx11::ostringstream::ostringstream(local_2358);
              std::operator<<((ostream *)local_2358,"Failed to write codebook vector");
              paVar6 = &local_2379;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2378,"lbg",paVar6);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
              std::__cxx11::string::~string(local_2378);
              std::allocator<char>::~allocator((allocator<char> *)&local_2379);
              local_4 = 1;
              local_1598 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_2358);
              goto LAB_00106555;
            }
            __gnu_cxx::
            __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
            ::operator++(&local_21d8);
          }
          if (local_30 != (char *)0x0) {
            std::ofstream::ofstream(local_2580);
            pcVar7 = local_30;
            std::operator|(_S_out,_S_bin);
            std::ofstream::open(local_2580,(_Ios_Openmode)pcVar7);
            bVar2 = std::ios::fail();
            if ((bVar2 & 1) == 0) {
              local_2728 = local_2580;
              this = &local_2028;
              std::vector<int,_std::allocator<int>_>::size(this);
              bVar1 = sptk::WriteStream<int>
                                (in_stack_ffffffffffffcf50,(int)((ulong)this >> 0x20),
                                 (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffcf40,
                                 (ostream *)
                                 CONCAT44(in_stack_ffffffffffffcf3c,in_stack_ffffffffffffcf38),
                                 in_stack_ffffffffffffcf30);
              if (bVar1) {
                local_1598 = 0;
              }
              else {
                std::__cxx11::ostringstream::ostringstream(local_28a0);
                std::operator<<((ostream *)local_28a0,"Failed to write codebook index");
                paVar6 = &local_28c1;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_28c0,"lbg",paVar6);
                sptk::PrintErrorMessage
                          (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
                std::__cxx11::string::~string(local_28c0);
                std::allocator<char>::~allocator((allocator<char> *)&local_28c1);
                local_4 = 1;
                local_1598 = 1;
                std::__cxx11::ostringstream::~ostringstream(local_28a0);
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_26f8);
              poVar3 = std::operator<<((ostream *)local_26f8,"Cannot open file ");
              std::operator<<(poVar3,local_30);
              paVar6 = &local_2719;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2718,"lbg",paVar6);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
              std::__cxx11::string::~string(local_2718);
              std::allocator<char>::~allocator((allocator<char> *)&local_2719);
              local_4 = 1;
              local_1598 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_26f8);
            }
            std::ofstream::~ofstream(local_2580);
            if (local_1598 != 0) goto LAB_00106555;
          }
          if (local_38 != (char *)0x0) {
            std::ofstream::ofstream(local_2ac8);
            pcVar7 = local_38;
            std::operator|(_S_out,_S_bin);
            std::ofstream::open(local_2ac8,(_Ios_Openmode)pcVar7);
            bVar2 = std::ios::fail();
            if ((bVar2 & 1) == 0) {
              local_2c70 = local_2ac8;
              bVar1 = sptk::WriteStream<double>((double)pvVar4,(ostream *)0x1063e4);
              in_stack_ffffffffffffcf14 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffcf14);
              if (bVar1) {
                local_1598 = 0;
              }
              else {
                std::__cxx11::ostringstream::ostringstream(local_2de8);
                std::operator<<((ostream *)local_2de8,"Failed to write total distance");
                paVar6 = &local_2e09;
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2e08,"lbg",paVar6);
                sptk::PrintErrorMessage
                          (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
                std::__cxx11::string::~string(local_2e08);
                std::allocator<char>::~allocator((allocator<char> *)&local_2e09);
                local_4 = 1;
                local_1598 = 1;
                std::__cxx11::ostringstream::~ostringstream(local_2de8);
              }
            }
            else {
              std::__cxx11::ostringstream::ostringstream(local_2c40);
              poVar3 = std::operator<<((ostream *)local_2c40,"Cannot open file ");
              std::operator<<(poVar3,local_38);
              paVar6 = &local_2c61;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2c60,"lbg",paVar6);
              sptk::PrintErrorMessage
                        (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
              std::__cxx11::string::~string(local_2c60);
              std::allocator<char>::~allocator((allocator<char> *)&local_2c61);
              local_4 = 1;
              local_1598 = 1;
              std::__cxx11::ostringstream::~ostringstream(local_2c40);
            }
            std::ofstream::~ofstream(local_2ac8);
            if (local_1598 != 0) goto LAB_00106555;
          }
          local_4 = 0;
          local_1598 = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_21a8);
          std::operator<<((ostream *)local_21a8,"Failed to design codebook");
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_21c8,"lbg",&local_21c9);
          sptk::PrintErrorMessage
                    (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
          std::__cxx11::string::~string(local_21c8);
          std::allocator<char>::~allocator((allocator<char> *)&local_21c9);
          local_4 = 1;
          local_1598 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_21a8);
        }
LAB_00106555:
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)
                   CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10));
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_1fe0);
        std::operator<<((ostream *)local_1fe0,"Failed to initialize LindeBuzoGrayAlgorithm");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2000,"lbg",&local_2001);
        sptk::PrintErrorMessage
                  (in_stack_ffffffffffffd0f0,(ostringstream *)in_stack_ffffffffffffd0e8);
        std::__cxx11::string::~string(local_2000);
        std::allocator<char>::~allocator((allocator<char> *)&local_2001);
        local_4 = 1;
        local_1598 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1fe0);
      }
      sptk::LindeBuzoGrayAlgorithm::~LindeBuzoGrayAlgorithm(in_stack_ffffffffffffcf00);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               *)CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10));
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)CONCAT44(in_stack_ffffffffffffcf14,in_stack_ffffffffffffcf10));
LAB_001065cd:
  std::ifstream::~ifstream(local_13f8);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  int seed(kDefaultSeed);
  int target_codebook_size(kDefaultTargetCodebookSize);
  const char* initial_codebook_file(NULL);
  const char* codebook_index_file(NULL);
  const char* total_distance_file(NULL);
  int min_num_vector_in_cluster(kDefaultMinNumVectorInCluster);
  int num_iteration(kDefaultNumIteration);
  double convergence_threshold(kDefaultConvergenceThreshold);
  double splitting_factor(kDefaultSplittingFactor);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "l:m:s:e:C:I:S:n:i:d:r:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &seed)) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be an integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToInteger(optarg, &target_codebook_size) ||
            target_codebook_size <= 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be greater than 1";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'C': {
        initial_codebook_file = optarg;
        break;
      }
      case 'I': {
        codebook_index_file = optarg;
        break;
      }
      case 'S': {
        total_distance_file = optarg;
        break;
      }
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &min_num_vector_in_cluster) ||
            min_num_vector_in_cluster <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -n option must be a positive integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &num_iteration) ||
            num_iteration <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -i option must be a positive integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'd': {
        if (!sptk::ConvertStringToDouble(optarg, &convergence_threshold) ||
            convergence_threshold < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -d option must be a non-negative number";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'r': {
        if (!sptk::ConvertStringToDouble(optarg, &splitting_factor) ||
            splitting_factor <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -r option must be a positive number";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("lbg", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lbg", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const int length(num_order + 1);
  std::vector<std::vector<double> > input_vectors;
  {
    std::vector<double> tmp(length);
    while (sptk::ReadStream(false, 0, 0, length, &tmp, &input_stream, NULL)) {
      input_vectors.push_back(tmp);
    }
  }
  if (input_vectors.empty()) return 0;

  std::vector<std::vector<double> > codebook_vectors;
  if (NULL == initial_codebook_file) {
    sptk::StatisticsAccumulation statistics_accumulation(num_order, 1);
    sptk::StatisticsAccumulation::Buffer buffer;
    for (std::vector<std::vector<double> >::iterator itr(input_vectors.begin());
         itr != input_vectors.end(); ++itr) {
      if (!statistics_accumulation.Run(*itr, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to initialize codebook";
        sptk::PrintErrorMessage("lbg", error_message);
        return 1;
      }
    }

    std::vector<double> mean(length);
    if (!statistics_accumulation.GetMean(buffer, &mean)) {
      std::ostringstream error_message;
      error_message << "Failed to initialize codebook";
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
    codebook_vectors.push_back(mean);
  } else {
    std::ifstream ifs2;
    ifs2.open(initial_codebook_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << initial_codebook_file;
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }

    std::vector<double> tmp(length);
    while (sptk::ReadStream(false, 0, 0, length, &tmp, &ifs2, NULL)) {
      codebook_vectors.push_back(tmp);
    }
  }

  sptk::LindeBuzoGrayAlgorithm codebook_design(
      num_order, static_cast<int>(codebook_vectors.size()),
      target_codebook_size, min_num_vector_in_cluster, num_iteration,
      convergence_threshold, splitting_factor, seed);
  if (!codebook_design.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize LindeBuzoGrayAlgorithm";
    sptk::PrintErrorMessage("lbg", error_message);
    return 1;
  }

  double total_distance;
  std::vector<int> codebook_indices(input_vectors.size());
  if (!codebook_design.Run(input_vectors, &codebook_vectors, &codebook_indices,
                           &total_distance)) {
    std::ostringstream error_message;
    error_message << "Failed to design codebook";
    sptk::PrintErrorMessage("lbg", error_message);
    return 1;
  }

  for (std::vector<std::vector<double> >::iterator itr(
           codebook_vectors.begin());
       itr != codebook_vectors.end(); ++itr) {
    if (!sptk::WriteStream(0, length, *itr, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write codebook vector";
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
  }

  if (NULL != codebook_index_file) {
    std::ofstream ofs;
    ofs.open(codebook_index_file, std::ios::out | std::ios::binary);
    if (ofs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << codebook_index_file;
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
    std::ostream& output_stream(ofs);

    if (!sptk::WriteStream(0, static_cast<int>(codebook_indices.size()),
                           codebook_indices, &output_stream, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write codebook index";
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
  }

  if (NULL != total_distance_file) {
    std::ofstream ofs;
    ofs.open(total_distance_file, std::ios::out | std::ios::binary);
    if (ofs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << total_distance_file;
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
    std::ostream& output_stream(ofs);

    if (!sptk::WriteStream(total_distance, &output_stream)) {
      std::ostringstream error_message;
      error_message << "Failed to write total distance";
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
  }

  return 0;
}